

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-trainer-CH.cc
# Opt level: O1

int main(int argc,char **argv)

{
  Parameters **ppPVar1;
  uint uVar2;
  char *pcVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *pvVar8;
  undefined8 uVar9;
  pointer pIVar10;
  char cVar11;
  __pid_t _Var12;
  size_t sVar13;
  istream *piVar14;
  ostream *poVar15;
  Trainer *this;
  Tensor *pTVar16;
  ulong uVar17;
  int iVar18;
  Instance *sent;
  ulong uVar19;
  int iVar20;
  pointer chars;
  undefined1 auVar21 [16];
  real rVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar25 [64];
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM3_Qb;
  uint toverall;
  double local_928;
  char **argv_local;
  int local_914;
  int local_910;
  uint local_90c;
  uint doverall;
  uint dpredict;
  uint tpredict;
  int argc_local;
  vector<Instance,_std::allocator<Instance>_> training;
  int total;
  uint uStack_8dc;
  char local_8d0 [16];
  time_point local_8c0;
  double local_8b8;
  double dcorr;
  double correct;
  string fname;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  string line;
  Model model;
  vector<Instance,_std::allocator<Instance>_> dev;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  y;
  basic_text_iprimitive<std::istream> local_790 [8];
  basic_text_oprimitive<std::ostream> local_788 [96];
  undefined1 local_728 [16];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_718;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_700;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_6e8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_6d0;
  ostringstream os;
  ifstream in_2;
  undefined7 uStack_53f;
  pointer local_538;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> local_530 [9];
  ios_base local_448 [272];
  RNNLanguageModel<cnn::FastLSTMBuilder> lm;
  
  argv_local = argv;
  argc_local = argc;
  cnn::Initialize(&argc_local,&argv_local,0x7c5,false);
  if (argc_local - 5U < 0xfffffffe) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar3 = *argv_local;
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2a6550);
    }
    else {
      sVar13 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar13);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," corpus.txt dev.txt [model.params]\n",0x23);
    return 1;
  }
  training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Reading training data from ",0x1b);
  pcVar3 = argv_local[1];
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2a6550);
  }
  else {
    sVar13 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"...\n",4);
  _total = (pointer)((ulong)uStack_8dc << 0x20);
  fname._M_dataplus._M_p._0_4_ = 0;
  std::ifstream::ifstream(&lm,argv_local[1],_S_in);
  if ((*(byte *)((long)&lm.p_wordpadding1 +
                *(long *)&lm.p_w[-1].non_zero_grads._M_h._M_rehash_policy) & 5) != 0) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/s-hierarchy-trainer-CH.cc"
                  ,0x1dc,"int main(int, char **)");
  }
  iVar18 = 0;
  iVar20 = 0;
  while( true ) {
    cVar11 = std::ios::widen((char)*(undefined8 *)&lm.p_w[-1].non_zero_grads._M_h._M_rehash_policy +
                             (char)&lm);
    piVar14 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&lm,(string *)&line,cVar11);
    if (((byte)piVar14[*(long *)(*(long *)piVar14 + -0x18) + 0x20] & 5) != 0) break;
    _os = (pointer)0x0;
    y.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    y.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    y.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    model.all_params.
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    model.all_params.
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    model.all_params.
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ReadSentencePair(&line,(vector<int,_std::allocator<int>_> *)&os,&wd,
                     (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)&model,&cd,&y,&ld,(int *)&fname,&total);
    if ((-(long)_os >> 2 !=
         ((long)y.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)y.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) ||
       (-(long)_os >> 2 !=
        ((long)model.all_params.
               super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)model.all_params.
               super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      __assert_fail("x.size() == y.size() && x.size() == c.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/s-hierarchy-trainer-CH.cc"
                    ,0x1e3,"int main(int, char **)");
    }
    if (_os == (pointer)0x0) {
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,line._M_dataplus._M_p,line._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar15);
      abort();
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_6d0,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)&model);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_6e8,&y);
    Instance::Instance((Instance *)&in_2,(vector<int,_std::allocator<int>_> *)&os,&local_6d0,
                       &local_6e8);
    std::vector<Instance,_std::allocator<Instance>_>::emplace_back<Instance>
              (&training,(Instance *)&in_2);
    Instance::~Instance((Instance *)&in_2);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_6e8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_6d0);
    uVar19 = -(long)_os;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&model);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&y);
    if (_os != (pointer)0x0) {
      operator_delete(_os);
    }
    iVar18 = iVar18 + (int)(uVar19 >> 2);
    iVar20 = iVar20 + 1;
  }
  poVar15 = (ostream *)std::ostream::operator<<(&std::cerr,iVar20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," lines, ",8);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," tokens, ",9);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," types\n",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"OOV ratio: ",0xb);
  poVar15 = std::ostream::_M_insert<double>
                      ((double)((float)(int)fname._M_dataplus._M_p / (float)total));
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Tags: ",6);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  std::ifstream::~ifstream(&lm);
  wd.frozen = true;
  ppPVar1 = &lm.p_wordpadding_2;
  lm.p_w = (LookupParameters *)ppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lm,"*UNK*","");
  cnn::Dict::SetUnk(&wd,(string *)&lm);
  if (lm.p_w != (LookupParameters *)ppPVar1) {
    operator_delete(lm.p_w);
  }
  lm.p_w = (LookupParameters *)ppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lm,"NULL","");
  endlabel = cnn::Dict::Convert(&ld,(string *)&lm);
  if (lm.p_w != (LookupParameters *)ppPVar1) {
    operator_delete(lm.p_w);
  }
  cd.frozen = true;
  ld.frozen = true;
  lm.p_w = (LookupParameters *)ppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lm,"*UNK*","");
  cnn::Dict::SetUnk(&cd,(string *)&lm);
  if (lm.p_w != (LookupParameters *)ppPVar1) {
    operator_delete(lm.p_w);
  }
  lm.p_w = (LookupParameters *)ppPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lm,"*UNK*","");
  cnn::Dict::SetUnk(&ld,(string *)&lm);
  if (lm.p_w != (LookupParameters *)ppPVar1) {
    operator_delete(lm.p_w);
  }
  VOCAB_SIZE = (uint)((ulong)((long)wd.words_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)wd.words_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
  CHAR_SIZE = (uint)((ulong)((long)cd.words_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)cd.words_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
  LABEL_SIZE = (uint)((ulong)((long)ld.words_.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)ld.words_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Reading dev data from ",0x16);
  pcVar3 = argv_local[2];
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2a6550);
  }
  else {
    sVar13 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"...\n",4);
  _total = _total & 0xffffffff00000000;
  fname._M_dataplus._M_p._0_4_ = 0;
  std::ifstream::ifstream(&lm,argv_local[2],_S_in);
  if ((*(byte *)((long)&lm.p_wordpadding1 +
                *(long *)&lm.p_w[-1].non_zero_grads._M_h._M_rehash_policy) & 5) != 0) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/s-hierarchy-trainer-CH.cc"
                  ,0x1ff,"int main(int, char **)");
  }
  iVar18 = 0;
  iVar20 = 0;
  while( true ) {
    cVar11 = std::ios::widen((char)*(undefined8 *)&lm.p_w[-1].non_zero_grads._M_h._M_rehash_policy +
                             (char)&lm);
    piVar14 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&lm,(string *)&line,cVar11);
    auVar21 = in_ZMM2._0_16_;
    if (((byte)piVar14[*(long *)(*(long *)piVar14 + -0x18) + 0x20] & 5) != 0) {
      poVar15 = (ostream *)std::ostream::operator<<(&std::cerr,iVar20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," lines, ",8);
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," tokens\n",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"OOV ratio: ",0xb);
      poVar15 = std::ostream::_M_insert<double>
                          ((double)((float)(int)fname._M_dataplus._M_p / (float)total));
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
      std::ifstream::~ifstream(&lm);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&os,"ordered",7);
      lm.p_w = (LookupParameters *)CONCAT71(lm.p_w._1_7_,0x5f);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&os,(char *)&lm,1);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      lm.p_w = (LookupParameters *)CONCAT71(lm.p_w._1_7_,0x5f);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&lm,1);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      lm.p_w = (LookupParameters *)CONCAT71(lm.p_w._1_7_,0x5f);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&lm,1);
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"-pid",4);
      _Var12 = getpid();
      poVar15 = (ostream *)std::ostream::operator<<(poVar15,_Var12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,".params",7);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Parameters will be written to: ",0x1f);
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           (char *)CONCAT44(fname._M_dataplus._M_p._4_4_,(int)fname._M_dataplus._M_p
                                           ),fname._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      model.lookup_params.
      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.gradient_norm_scratch = (float *)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      model.all_params.
      super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      model.params.super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl
      .super__Vector_impl_data =
           (_Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>)0x0;
      model.lookup_params.
      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      model.lookup_params.
      super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      this = (Trainer *)operator_new(0x70);
      this->eta0 = 0.01;
      this->eta = 0.01;
      this->eta_decay = 0.0;
      this->epoch = 0.0;
      this->lambda = 1e-06;
      this->clipping_enabled = 1.0;
      this->clip_threshold = 5.0;
      this->clips = 0.0;
      this->updates = 0.0;
      this->model = &model;
      this->_vptr_Trainer = (_func_int **)&PTR__MomentumSGDTrainer_002a4968;
      *(undefined4 *)&this[1]._vptr_Trainer = 0x3f666666;
      *(undefined1 *)((long)&this[1]._vptr_Trainer + 4) = 0;
      this[1].eta0 = 0.0;
      this[1].eta = 0.0;
      this[1].eta_decay = 0.0;
      this[1].epoch = 0.0;
      this[1].lambda = 0.0;
      this[1].clipping_enabled = 0.0;
      this[1].clip_threshold = 0.0;
      this[1].clips = 0.0;
      this[1].lambda = 0.0;
      this[1].clipping_enabled = 0.0;
      this[1].clip_threshold = 0.0;
      this[1].clips = 0.0;
      *(undefined8 *)&this[1].updates = 0;
      this[1].model = (Model *)0x0;
      auVar25 = ZEXT1664(auVar21);
      RNNLanguageModel<cnn::FastLSTMBuilder>::RNNLanguageModel(&lm,&model);
      if (argc_local == 4) {
        std::__cxx11::string::string((string *)&total,argv_local[3],(allocator *)&in_2);
        std::ifstream::ifstream(&in_2,(string *)&total,_S_in);
        boost::archive::text_iarchive::text_iarchive((text_iarchive *)&y,(istream *)&in_2,0);
        boost::serialization::
        singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::Model>_>::
        get_instance();
        boost::archive::detail::basic_iarchive::load_object(&y,(basic_iserializer *)&model);
        boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&y);
        boost::archive::basic_text_iprimitive<std::istream>::~basic_text_iprimitive(local_790);
        std::ifstream::~ifstream(&in_2);
        if (_total != local_8d0) {
          operator_delete(_total);
        }
      }
      uVar19 = ((long)training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&order,uVar19,(allocator_type *)&in_2);
      if ((long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        uVar17 = 0;
        do {
          order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar17] = (uint)uVar17;
          uVar17 = uVar17 + 1;
        } while ((uVar17 & 0xffffffff) <
                 (ulong)((long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      uVar9 = ___throw_bad_array_new_length;
      pvVar8 = _VTT;
      local_8b8 = -9e+99;
      local_90c = (uint)CONCAT71((int7)((ulong)___throw_bad_array_new_length >> 8),1);
      local_910 = 0;
      local_914 = 0;
      do {
        _in_2 = local_530;
        std::__cxx11::string::_M_construct<char_const*>((string *)&in_2,"completed in","");
        _total = local_8d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&total,_in_2,
                   (long)&(local_538->
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          )._M_impl.super__Vector_impl_data._M_start +
                   (long)&(_in_2->
                          super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>)
                          ._M_impl.super__Vector_impl_data._M_start);
        local_8c0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        if (_in_2 != local_530) {
          operator_delete(_in_2);
        }
        tpredict = 0;
        toverall = 0;
        correct = 0.0;
        local_914 = local_914 + 0x32;
        local_928 = 0.0;
        iVar18 = 0x32;
        do {
          if (((long)training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 -
              (uVar19 & 0xffffffff) == 0) {
            if ((local_90c & 1) == 0) {
              auVar25 = ZEXT464(0x3f800000);
              fVar4 = this->epoch + 1.0;
              this->epoch = fVar4;
              auVar21 = vfmadd132ss_fma(ZEXT416((uint)fVar4),auVar25._0_16_,
                                        ZEXT416((uint)this->eta_decay));
              this->eta = this->eta0 / auVar21._0_4_;
            }
            else {
              local_90c = 0;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"**SHUFFLE\n",10);
            uVar19 = 0;
            std::
            shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,cnn::rndeng);
          }
          cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&in_2);
          uVar2 = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19 & 0xffffffff];
          RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
                    ((RNNLanguageModel<cnn::FastLSTMBuilder> *)&y,
                     (vector<int,_std::allocator<int>_> *)&lm,
                     (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar2),
                     &training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar2].chars,
                     (ComputationGraph *)
                     &training.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar2].labels,(double *)&in_2,
                     (uint *)&correct,&tpredict,SUB81(&toverall,0));
          pTVar16 = cnn::ComputationGraph::forward((ComputationGraph *)&in_2);
          rVar22 = cnn::as_scalar(pTVar16);
          cnn::ComputationGraph::backward((ComputationGraph *)&in_2);
          (*this->_vptr_Trainer[2])(SUB648(ZEXT464(0x3f800000),0),this);
          uVar19 = (ulong)((int)uVar19 + 1);
          local_928 = local_928 + (double)rVar22;
          cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&in_2);
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
        cnn::Trainer::status(this);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," E = ",5);
        auVar21._8_8_ = in_XMM3_Qb;
        auVar21._0_8_ = in_XMM3_Qa;
        auVar21 = vcvtusi2sd_avx512f(auVar21,toverall);
        poVar15 = std::ostream::_M_insert<double>(local_928 / auVar21._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," ppl=",5);
        auVar5._8_8_ = in_XMM3_Qb;
        auVar5._0_8_ = in_XMM3_Qa;
        auVar21 = vcvtusi2sd_avx512f(auVar5,toverall);
        dVar23 = exp(local_928 / auVar21._0_8_);
        poVar15 = std::ostream::_M_insert<double>(dVar23);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15," (acc=",6);
        auVar21 = vcvtusi2sd_avx512f(auVar25._0_16_,toverall);
        poVar15 = std::ostream::_M_insert<double>(correct / auVar21._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar15,") ",2);
        pIVar10 = dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_910 = local_910 + 1;
        if ((uint)(local_910 * -0x3d70a3d7) < 0xa3d70a4) {
          dpredict = 0;
          doverall = 0;
          dcorr = 0.0;
          eval = true;
          for (chars = dev.super__Vector_base<Instance,_std::allocator<Instance>_>._M_impl.
                       super__Vector_impl_data._M_start; chars != pIVar10; chars = chars + 1) {
            cnn::ComputationGraph::ComputationGraph((ComputationGraph *)&in_2);
            RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
                      ((RNNLanguageModel<cnn::FastLSTMBuilder> *)&y,
                       (vector<int,_std::allocator<int>_> *)&lm,
                       (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)chars,&chars->chars,(ComputationGraph *)&chars->labels,(double *)&in_2,
                       (uint *)&dcorr,&dpredict,SUB81(&doverall,0));
            pTVar16 = cnn::ComputationGraph::forward((ComputationGraph *)&in_2);
            cnn::as_scalar(pTVar16);
            cnn::ComputationGraph::~ComputationGraph((ComputationGraph *)&in_2);
          }
          eval = false;
          auVar21 = vpinsrd_avx(ZEXT416(dpredict),doverall,1);
          auVar21 = vcvtudq2pd_avx512vl(auVar21);
          auVar24._8_8_ = dcorr;
          auVar24._0_8_ = dcorr;
          local_728 = vdivpd_avx(auVar24,auVar21);
          auVar25 = ZEXT1664(local_728);
          auVar21 = vshufpd_avx(local_728,local_728,1);
          dVar23 = auVar21._0_8_;
          local_928 = (local_728._0_8_ * (dVar23 + dVar23)) / (dVar23 + local_728._0_8_);
          if (local_8b8 < local_928) {
            std::ofstream::ofstream((ComputationGraph *)&in_2,(string *)&fname,_S_out);
            boost::archive::text_oarchive::text_oarchive((text_oarchive *)&y,(ostream *)&in_2,0);
            boost::serialization::
            singleton<boost::archive::detail::oserializer<boost::archive::text_oarchive,_cnn::Model>_>
            ::get_instance();
            boost::archive::detail::basic_oarchive::save_object(&y,(basic_oserializer *)&model);
            boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)&y);
            boost::archive::basic_text_oprimitive<std::ostream>::~basic_text_oprimitive(local_788);
            _in_2 = pvVar8;
            *(undefined8 *)
             (&in_2 + (long)pvVar8[-1].
                            super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) = uVar9;
            std::filebuf::~filebuf((filebuf *)&local_538);
            std::ios_base::~ios_base(local_448);
            local_8b8 = local_928;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\n***DEV [epoch=",0xf);
          auVar6._8_8_ = in_XMM3_Qb;
          auVar6._0_8_ = in_XMM3_Qa;
          auVar21 = vcvtusi2sd_avx512f(auVar6,local_914);
          auVar7._8_8_ = in_XMM3_Qb;
          auVar7._0_8_ = in_XMM3_Qa;
          auVar5 = vcvtusi2sd_avx512f(auVar7,((long)training.
                                                  super__Vector_base<Instance,_std::allocator<Instance>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)training.
                                                  super__Vector_base<Instance,_std::allocator<Instance>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                             -0x71c71c71c71c71c7);
          poVar15 = std::ostream::_M_insert<double>(auVar21._0_8_ / auVar5._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] P = ",6);
          poVar15 = std::ostream::_M_insert<double>((double)local_728._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," R = ",5);
          poVar15 = std::ostream::_M_insert<double>(dVar23);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," F=",3);
          poVar15 = std::ostream::_M_insert<double>(local_928);
          _in_2 = (vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                  CONCAT71(uStack_53f,0x20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&in_2,1);
        }
        cnn::Timer::~Timer((Timer *)&total);
      } while( true );
    }
    _os = (pointer)0x0;
    y.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    y.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    y.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    model.all_params.
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    model.all_params.
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    model.all_params.
    super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ReadSentencePair(&line,(vector<int,_std::allocator<int>_> *)&os,&wd,
                     (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)&model,&cd,&y,&ld,(int *)&fname,&total);
    if (-(long)_os >> 2 !=
        ((long)y.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)y.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) break;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_700,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)&model);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_718,&y);
    Instance::Instance((Instance *)&in_2,(vector<int,_std::allocator<int>_> *)&os,&local_700,
                       &local_718);
    std::vector<Instance,_std::allocator<Instance>_>::emplace_back<Instance>(&dev,(Instance *)&in_2)
    ;
    Instance::~Instance((Instance *)&in_2);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_718);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_700);
    uVar19 = -(long)_os;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&model);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&y);
    if (_os != (pointer)0x0) {
      operator_delete(_os);
    }
    iVar18 = iVar18 + (int)(uVar19 >> 2);
    iVar20 = iVar20 + 1;
  }
  __assert_fail("x.size() == y.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/impl/s-hierarchy-trainer-CH.cc"
                ,0x206,"int main(int, char **)");
}

Assistant:

int main(int argc, char** argv) {
  cnn::Initialize(argc, argv, 1989);
  if (argc != 3 && argc != 4) {
    cerr << "Usage: " << argv[0] << " corpus.txt dev.txt [model.params]\n";
    return 1;
  }
  vector<Instance> training,dev;
  string line;

  int tlc = 0;
  int ttoks = 0;
  
  cerr << "Reading training data from " << argv[1] << "...\n";
  {
    int total = 0;
    int unk = 0;
    ifstream in(argv[1]);
    assert(in);
    while(getline(in, line)) {
      ++tlc;
      vector<int> x;
      vector< vector<int> > y;
      vector< vector<int> > c;
      ReadSentencePair(line, &x, &wd, c, &cd, y, &ld, unk, total);
      assert(x.size() == y.size() && x.size() == c.size());
      if (x.size() == 0) { cerr << line << endl; abort(); }
      training.push_back(Instance(x,c,y));
      ttoks += x.size();
    }
    cerr << tlc << " lines, " << ttoks << " tokens, " << wd.size() << " types\n";
    cerr << "OOV ratio: " << float(unk)/total<<"\n";
    cerr << "Tags: " << ld.size() << endl;
  }
  wd.Freeze();
  wd.SetUnk("*UNK*");
  endlabel = ld.Convert("NULL");
  cd.Freeze();
  ld.Freeze(); // no new tag types allowed

  cd.SetUnk("*UNK*");
  ld.SetUnk("*UNK*");  
  VOCAB_SIZE = wd.size();
  CHAR_SIZE = cd.size();
  LABEL_SIZE = ld.size();

  int dlc = 0;
  int dtoks = 0;
  cerr << "Reading dev data from " << argv[2] << "...\n";
  {
    int total = 0;
    int unk = 0;
    ifstream in(argv[2]);
    assert(in);
    while(getline(in, line)) {
      ++dlc;
      vector<int> x;
      vector< vector<int> > y;
      vector< vector<int> > c;
      ReadSentencePair(line, &x, &wd, c, &cd, y, &ld, unk, total);
      assert(x.size() == y.size());
      dev.push_back(Instance(x,c,y));
      dtoks += x.size();
    }
    cerr << dlc << " lines, " << dtoks << " tokens\n";
    cerr << "OOV ratio: " << float(unk)/total<<"\n";
  }
  ostringstream os;
  os << "ordered"
     << '_' << LAYERS
     << '_' << INPUT_DIM
     << '_' << HIDDEN_DIM
     << "-pid" << getpid() << ".params";
  const string fname = os.str();
  cerr << "Parameters will be written to: " << fname << endl;
  double best = -9e+99;

  Model model;
  bool use_momentum = true;
  Trainer* sgd = nullptr;
  if (use_momentum)
    sgd = new MomentumSGDTrainer(&model);
  else
    sgd = new SimpleSGDTrainer(&model);

  RNNLanguageModel<FastLSTMBuilder> lm(model);
  //RNNLanguageModel<SimpleRNNBuilder> lm(model);
  if (argc == 4) {
    string fname = argv[3];
    ifstream in(fname);
    boost::archive::text_iarchive ia(in);
    ia >> model;
  }

  unsigned report_every_i = 50;
  unsigned dev_every_i_reports = 25;
  unsigned si = training.size();
  vector<unsigned> order(training.size());
  for (unsigned i = 0; i < order.size(); ++i) order[i] = i;
  bool first = true;
  int report = 0;
  unsigned lines = 0;
  while(1) {
    Timer iteration("completed in");
    double loss = 0;
    unsigned tpredict = 0;
    unsigned toverall = 0;
    double correct = 0;
    for (unsigned i = 0; i < report_every_i; ++i) {
      if (si == training.size()) {
        si = 0;
        if (first) { first = false; } else { sgd->update_epoch(); }
        cerr << "**SHUFFLE\n";
        shuffle(order.begin(), order.end(), *rndeng);
      }

      // build graph for this instance
      ComputationGraph cg;
      auto& sent = training[order[si]];
//      cerr<<si<<" "<<order[si]<<endl;
//      sent.show();
      ++si;
      lm.BuildTaggingGraph(sent.words, sent.chars, sent.labels, cg, &correct, &tpredict, &toverall, true);
//      cerr<<"done"<<endl;
      loss += as_scalar(cg.forward());
      cg.backward();
      sgd->update(1.0);
      ++lines;
    }
    sgd->status();
    cerr << " E = " << (loss / toverall) << " ppl=" << exp(loss / toverall) << " (acc=" << (correct / toverall) << ") ";

    // show score on dev data?
    report++;
    if (report % dev_every_i_reports == 0) {
      double dloss = 0;
      unsigned dpredict = 0;
      unsigned doverall = 0;
      double dcorr = 0;
      eval = true;
      //lm.p_th2t->scale_parameters(pdrop);
      for (auto& sent : dev) {
        ComputationGraph cg;
        lm.BuildTaggingGraph(sent.words, sent.chars, sent.labels, cg, &dcorr, &dpredict, &doverall, false);
        dloss += as_scalar(cg.forward());
      }
      //lm.p_th2t->scale_parameters(1/pdrop);
      eval = false;
      double P = (dcorr / dpredict);
      double R = (dcorr / doverall);
      double F = 2*P*R / (P+R);
      if (F > best) {
        best = F;
        ofstream out(fname);
        boost::archive::text_oarchive oa(out);
        oa << model;
      }
      cerr << "\n***DEV [epoch=" << (lines / (double)training.size()) << "] P = " << P << " R = " << R << " F=" << F << ' ';
    }
  }
  delete sgd;
}